

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O2

bool __thiscall
ON_BinaryArchive::EndRead3dmChunk(ON_BinaryArchive *this,bool bSupressPartiallyReadChunkWarning)

{
  ON__UINT32 OVar1;
  ulong uVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  uint version_number;
  long lVar6;
  ON_3DM_BIG_CHUNK *pOVar7;
  char *pcVar8;
  ulong uVar9;
  int iVar10;
  undefined7 in_register_00000031;
  uint uVar11;
  uint uVar12;
  ulong bytes_from_start;
  uchar two_crc_bytes [2];
  uint app_date;
  uint app_month;
  uint app_year;
  undefined4 local_54;
  uint app_major_version;
  uint file_major_version;
  uint file_date;
  uint file_month;
  ulong local_40;
  ulong local_38;
  
  bVar3 = ReadMode(this);
  if (!bVar3) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
               ,0x1949,"","ReadMode() = false.");
    return false;
  }
  lVar6 = (long)(this->m_chunk).m_count;
  pOVar7 = (this->m_chunk).m_a;
  if (pOVar7 + lVar6 + -1 == (ON_3DM_BIG_CHUNK *)0x0 || lVar6 < 1) {
    return false;
  }
  local_54 = (undefined4)CONCAT71(in_register_00000031,bSupressPartiallyReadChunkWarning);
  uVar9 = this->m_current_positionX;
  bytes_from_start = pOVar7[lVar6 + -1].m_start_offset;
  bVar3 = true;
  if (pOVar7[lVar6 + -1].m_bLongChunk != '\0') {
    if (pOVar7[lVar6 + -1].m_big_value < 0) {
      Internal_ReportCriticalError(this);
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                 ,0x1959,"","ON_BinaryArchive::EndRead3dmChunk - negative chunk length");
      if (pOVar7[lVar6 + -1].m_bLongChunk == '\0') goto LAB_003c34f8;
    }
    else {
      bytes_from_start = bytes_from_start + pOVar7[lVar6 + -1].m_big_value;
    }
    bVar4 = this->m_bChunkBoundaryCheck;
    if (pOVar7[lVar6 + -1].m_do_crc16 == '\0') {
      if ((pOVar7[lVar6 + -1].m_do_crc32 != '\0') && (uVar9 + 4 == bytes_from_start)) {
        OVar1 = pOVar7[lVar6 + -1].m_crc32;
        this->m_bChunkBoundaryCheck = false;
        bVar3 = ReadInt32(this,1,(ON__INT32 *)two_crc_bytes);
        this->m_bChunkBoundaryCheck = bVar4;
        if ((bVar3) && (uVar9 = bytes_from_start, _two_crc_bytes != OVar1)) {
          Internal_ReportCRCError(this);
          pcVar8 = "ON_BinaryArchive::EndRead3dmChunk: CRC32 error.";
          iVar10 = 0x198d;
          goto LAB_003c34ee;
        }
      }
    }
    else if (uVar9 + 2 == bytes_from_start) {
      _two_crc_bytes = _two_crc_bytes & 0xffff0000;
      this->m_bChunkBoundaryCheck = false;
      bVar3 = ReadByte(this,2,two_crc_bytes);
      this->m_bChunkBoundaryCheck = bVar4;
      if ((bVar3) && (uVar9 = bytes_from_start, pOVar7[lVar6 + -1].m_crc16 != 0)) {
        Internal_ReportCRCError(this);
        pcVar8 = "ON_BinaryArchive::EndRead3dmChunk: CRC16 error.";
        iVar10 = 0x1973;
LAB_003c34ee:
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                   ,iVar10,"",pcVar8);
        uVar9 = bytes_from_start;
      }
    }
  }
LAB_003c34f8:
  uVar2 = pOVar7[lVar6 + -1].m_start_offset;
  if (uVar9 < uVar2) {
    Internal_ReportCriticalError(this);
    pcVar8 = "ON_BinaryArchive::EndRead3dmChunk: current position before start of current chunk.";
    iVar10 = 0x19a6;
  }
  else {
    if (uVar9 <= bytes_from_start) {
      if (bytes_from_start != uVar9) {
        local_38 = bytes_from_start;
        if ((uVar9 != uVar2) &&
           ((this->m_3dm_version != 1 || ((this->m_error_message_mask & 2) == 0)))) {
          _two_crc_bytes = 0;
          file_month = 0;
          file_date = 0;
          file_major_version = 0;
          uVar11 = 0;
          local_40 = uVar9;
          bVar4 = ON_VersionNumberParse
                            (this->m_3dm_opennurbs_version,&file_major_version,(uint *)0x0,
                             (uint *)two_crc_bytes,&file_month,&file_date,(uint *)0x0);
          uVar12 = 0;
          if (bVar4) {
            uVar12 = (_two_crc_bytes * 100 + file_month) * 100 + file_date;
          }
          app_year = 0;
          app_month = 0;
          app_date = 0;
          app_major_version = 0;
          version_number = ON::Version();
          bVar4 = ON_VersionNumberParse
                            (version_number,&app_major_version,(uint *)0x0,&app_year,&app_month,
                             &app_date,(uint *)0x0);
          if (bVar4) {
            uVar11 = (app_year * 100 + app_month) * 100 + app_date;
          }
          uVar9 = local_40;
          if ((uVar12 <= uVar11 && (char)local_54 == '\0') &&
              file_major_version <= app_major_version) {
            ON_WarningEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                         ,0x19ed,"",
                         "ON_BinaryArchive::EndRead3dmChunk: partially read chunk - skipping bytes at end of current chunk."
                        );
            uVar9 = local_40;
          }
        }
        bVar4 = this->m_bChunkBoundaryCheck;
        this->m_bChunkBoundaryCheck = false;
        if (uVar9 <= local_38 && local_38 - uVar9 != 0) {
          bVar5 = SeekForward(this,local_38 - uVar9);
          bVar3 = (bool)(bVar5 & bVar3);
        }
        this->m_bChunkBoundaryCheck = bVar4;
      }
      goto LAB_003c356b;
    }
    Internal_ReportCriticalError(this);
    pcVar8 = "ON_BinaryArchive::EndRead3dmChunk: current position after end of current chunk.";
    iVar10 = 0x19ad;
  }
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
             ,iVar10,"",pcVar8);
  bVar4 = SeekFromStart(this,bytes_from_start);
  bVar3 = (bool)(bVar4 & bVar3);
LAB_003c356b:
  (*(this->m_chunk)._vptr_ON_SimpleArray[2])(&this->m_chunk,(ulong)((this->m_chunk).m_count - 1));
  lVar6 = (long)(this->m_chunk).m_count;
  pOVar7 = (this->m_chunk).m_a + lVar6;
  if (pOVar7 == (ON_3DM_BIG_CHUNK *)0x28 || lVar6 < 1) {
    bVar4 = false;
  }
  else {
    bVar4 = true;
    if (pOVar7[-1].m_do_crc16 == '\0') {
      bVar4 = pOVar7[-1].m_do_crc32 != '\0';
    }
  }
  this->m_bDoChunkCRC = bVar4;
  return bVar3;
}

Assistant:

bool ON_BinaryArchive::EndRead3dmChunk(bool bSupressPartiallyReadChunkWarning)  
{
  if (false == ReadMode())
  {
    ON_ERROR("ReadMode() = false.");
    return false;
  }

  //int length = 0;
  bool rc = false;
  ON_3DM_BIG_CHUNK* c = m_chunk.Last();
  if ( c ) 
  {
    ON__UINT64 file_offset = CurrentPosition();
    ON__UINT64 end_offset = c->m_start_offset;
    if ( c->m_bLongChunk )
    {
      if ( c->m_big_value < 0 )
      {
        Internal_ReportCriticalError();
        ON_ERROR("ON_BinaryArchive::EndRead3dmChunk - negative chunk length");
      }
      else
      {
        end_offset += ((ON__UINT64)c->m_big_value);
      }
    }

    if ( c->m_bLongChunk ) 
    {
      const bool bChunkBoundaryCheck = m_bChunkBoundaryCheck;
      if ( c->m_do_crc16 ) 
      {
        if ( file_offset+2 == end_offset )
        {
          // read 16 bit CRC
          unsigned char two_crc_bytes[2] = {0,0};
          m_bChunkBoundaryCheck = false;
          rc = ReadByte( 2, two_crc_bytes );
          m_bChunkBoundaryCheck = bChunkBoundaryCheck;
          if (rc) 
          {
            file_offset+=2;
            if (c->m_crc16) 
            {
              Internal_ReportCRCError();
              ON_ERROR("ON_BinaryArchive::EndRead3dmChunk: CRC16 error.");
            }
          }
        }
        else
        {
          // partially read chunk - crc check not possible.
          rc = true;
        }
      }
      else if ( c->m_do_crc32 ) 
      {
        if ( file_offset+4 == end_offset )
        {
          // read 32 bit CRC
          ON__UINT32 crc1 = c->m_crc32;
          ON__UINT32 crc0;
          m_bChunkBoundaryCheck = false;
          rc = ReadInt32( 1, (ON__INT32*)&crc0 );
          m_bChunkBoundaryCheck = bChunkBoundaryCheck;
          if (rc) 
          {
            file_offset+=4;
            if (crc0 != crc1) 
            {
              Internal_ReportCRCError();
              ON_ERROR("ON_BinaryArchive::EndRead3dmChunk: CRC32 error.");
            }
          }
        }
        else
        {
          // partially read chunk - crc check not possible.
          rc = true;
        }
      }
      else 
      {
        // no crc in this chunk
        rc = true;
      }
    }
    else 
    {
      rc = true;
    }

    // check length and seek to end of chunk if things are amiss
    if ( file_offset < c->m_start_offset ) 
    {
      Internal_ReportCriticalError();
      ON_ERROR("ON_BinaryArchive::EndRead3dmChunk: current position before start of current chunk.");
      if ( !SeekFromStart( end_offset ) )
        rc = false;
    }
    else if ( file_offset > end_offset ) 
    {
      Internal_ReportCriticalError();
      ON_ERROR("ON_BinaryArchive::EndRead3dmChunk: current position after end of current chunk.");
      if ( !SeekFromStart( end_offset ) )
        rc = false;
    }
    else if ( file_offset != end_offset ) 
    {
      // partially read chunk - happens when chunks are skipped or old code
      // reads a new minor version of a chunk whnich has added information.
      if ( file_offset != c->m_start_offset ) 
      {
        if ( m_3dm_version != 1 || (m_error_message_mask&0x02) == 0 ) 
        {
          // when reading v1 files, there are some situations where
          // it is reasonable to attempt to read 4 bytes at the end
          // of a file.  The above test prevents making a call
          // to ON_WARNING() in these situations.

          unsigned int file_year = 0;
          unsigned int file_month = 0;
          unsigned int file_date = 0;
          unsigned int file_major_version = 0;
          const bool bHaveFileDate = ON_VersionNumberParse(
            m_3dm_opennurbs_version,
            &file_major_version,
            0,
            &file_year,
            &file_month,
            &file_date,
            0
            );

          const unsigned int file_ymd
            = bHaveFileDate
            ? ((file_year * 100 + file_month) * 100 + file_date)
            : 0;

          unsigned int app_year = 0;
          unsigned int app_month = 0;
          unsigned int app_date = 0;
          unsigned int app_major_version = 0;
          const bool bHaveAppDate = ON_VersionNumberParse(
            ON::Version(),
            &app_major_version,
            0,
            &app_year,
            &app_month,
            &app_date,
            0
            );

          const unsigned int app_ymd
            = bHaveAppDate
            ? ((app_year * 100 + app_month) * 100 + app_date)
            : 0;

          if (file_major_version <= app_major_version 
            && file_ymd <= app_ymd
            )
          {
            // We are reading a file written by this version or an
            // earlier version of opennurbs.  
            // There should not be any partially read chunks.
            if (!bSupressPartiallyReadChunkWarning)
            {
              ON_WARNING("ON_BinaryArchive::EndRead3dmChunk: partially read chunk - skipping bytes at end of current chunk.");
            }
          }
        }
      }

      const bool bChunkBoundaryCheck = m_bChunkBoundaryCheck;
      m_bChunkBoundaryCheck = false;
      if ( end_offset > file_offset )
      {
        if ( !SeekForward(end_offset - file_offset) )
          rc = false;
      }
      else if ( end_offset < file_offset )
      {
        if ( !SeekBackward(file_offset - end_offset) )
          rc = false;
      }
      m_bChunkBoundaryCheck = bChunkBoundaryCheck;

    }

    m_chunk.Remove();
    c = m_chunk.Last();
    m_bDoChunkCRC = (c && (c->m_do_crc16 || c->m_do_crc32));
  }
  return rc;
}